

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winmakefile.cpp
# Opt level: O2

void __thiscall Win32MakefileGenerator::processRcFileVar(Win32MakefileGenerator *this)

{
  QString file;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  FILE *__stream;
  qsizetype qVar4;
  bool bVar5;
  char cVar6;
  ProStringList *pPVar7;
  pointer pQVar8;
  QTextStream *pQVar9;
  QString *pQVar10;
  QList<ProString> *pQVar11;
  iterator iVar12;
  QList<ProString> *pQVar13;
  char16_t *pcVar14;
  ProString *icon;
  ProString *pPVar15;
  QArrayDataPointer<char16_t> *pQVar16;
  ulong uVar17;
  int iVar18;
  MakefileGenerator *this_00;
  char *pcVar19;
  MakefileGenerator *pMVar20;
  QMakeProject *pQVar21;
  long lVar22;
  long in_FS_OFFSET;
  bool bVar23;
  MakefileGenerator *pMVar24;
  undefined4 uVar25;
  undefined4 in_stack_fffffffffffffa78;
  int in_stack_fffffffffffffa7c;
  QArrayDataPointer<char16_t> local_580;
  QArrayDataPointer<char16_t> local_568 [2];
  ProString local_538;
  ProKey local_508;
  QFileInfo fi;
  QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString> local_498;
  QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString>,_const_char_(&)[10]>
  local_428;
  QString *local_3b8;
  char16_t *pcStack_3b0;
  char *local_3a8;
  char (*local_348) [4];
  QArrayDataPointer<char16_t> local_338;
  QArrayDataPointer<char16_t> local_318;
  QArrayDataPointer<char16_t> local_2f8;
  QArrayDataPointer<char16_t> local_2d8;
  ProString local_2b8;
  QArrayDataPointer<char16_t> local_288;
  QArrayDataPointer<char16_t> local_268;
  QArrayDataPointer<char16_t> local_248;
  QArrayDataPointer<char16_t> local_228;
  QArrayDataPointer<char16_t> local_208;
  QArrayDataPointer<ProString> local_1f0;
  QArrayDataPointer<QString> local_1d8;
  QArrayDataPointer<char16_t> local_1b8;
  QArrayDataPointer<QString> local_198;
  undefined4 local_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  QArrayDataPointer<char> local_168;
  ProKey local_148;
  QArrayDataPointer<char16_t> local_118;
  QArrayDataPointer<char16_t> local_100;
  ProKey local_e8;
  ProKey local_b8;
  ProKey local_88;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (Option::qmake_mode == QMAKE_GENERATE_NOTHING) goto LAB_001dbb88;
  local_58.size = -0x5555555555555556;
  local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_58.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  pQVar21 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_428,"QMAKE_MANIFEST");
  QMakeEvaluator::first((ProString *)&local_3b8,&pQVar21->super_QMakeEvaluator,(ProKey *)&local_428)
  ;
  ProString::toQString((QString *)&local_58,(ProString *)&local_3b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
  pQVar21 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_3b8,"VERSION");
  pPVar7 = QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&local_3b8);
  lVar22 = (pPVar7->super_QList<ProString>).d.size;
  iVar18 = (int)lVar22;
  uVar25 = (undefined4)((ulong)lVar22 >> 0x20);
  pMVar20 = &this->super_MakefileGenerator;
  if (lVar22 == 0) {
    pQVar21 = (this->super_MakefileGenerator).project;
    ProKey::ProKey(&local_88,"RC_ICONS");
    pPVar7 = QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,&local_88);
    if (((pPVar7->super_QList<ProString>).d.size != 0) || (local_58.size != 0)) goto LAB_001d9cfa;
    bVar1 = false;
    bVar5 = false;
    bVar2 = false;
    bVar3 = false;
LAB_001d9db2:
    pQVar21 = pMVar20->project;
    ProKey::ProKey((ProKey *)&local_428,"QMAKE_WRITE_DEFAULT_RC");
    pPVar7 = QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&local_428);
    bVar23 = (pPVar7->super_QList<ProString>).d.size != 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
    if (bVar5) {
LAB_001d9df4:
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_148);
      goto LAB_001d9e01;
    }
  }
  else {
LAB_001d9cfa:
    pQVar21 = (this->super_MakefileGenerator).project;
    ProKey::ProKey(&local_b8,"RC_FILE");
    pPVar7 = QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,&local_b8);
    if ((pPVar7->super_QList<ProString>).d.size != 0) {
      bVar3 = true;
      bVar1 = false;
      bVar5 = false;
      bVar2 = false;
      goto LAB_001d9db2;
    }
    pQVar21 = (this->super_MakefileGenerator).project;
    ProKey::ProKey(&local_e8,"RES_FILE");
    pPVar7 = QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,&local_e8);
    if ((pPVar7->super_QList<ProString>).d.size != 0) {
      bVar1 = false;
LAB_001d9daf:
      bVar5 = false;
      bVar2 = true;
      bVar3 = true;
      goto LAB_001d9db2;
    }
    pQVar21 = (this->super_MakefileGenerator).project;
    QString::QString((QString *)&local_100,"no_generated_target_info");
    bVar5 = QMakeProject::isActiveConfig(pQVar21,(QString *)&local_100,false);
    if (bVar5) {
      bVar1 = true;
      goto LAB_001d9daf;
    }
    pQVar21 = (this->super_MakefileGenerator).project;
    QString::QString((QString *)&local_118,"shared");
    bVar5 = QMakeProject::isActiveConfig(pQVar21,(QString *)&local_118,false);
    bVar1 = true;
    bVar2 = true;
    bVar3 = true;
    bVar23 = true;
    if (!bVar5) {
      pQVar21 = pMVar20->project;
      ProKey::ProKey(&local_148,"QMAKE_APP_FLAG");
      pPVar7 = QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,&local_148);
      bVar1 = true;
      bVar5 = true;
      bVar2 = true;
      bVar3 = true;
      bVar23 = true;
      if ((pPVar7->super_QList<ProString>).d.size == 0) goto LAB_001d9db2;
      goto LAB_001d9df4;
    }
LAB_001d9e01:
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
  }
  if (bVar1) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_100);
  }
  if (bVar2) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
  }
  if (bVar3) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
  }
  this_00 = pMVar20;
  if (CONCAT44(uVar25,iVar18) == 0) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3b8);
  if (bVar23) {
    local_168.size = 0;
    local_168.d = (Data *)0x0;
    local_168.ptr = (char *)0x0;
    local_178 = 0xaaaaaaaa;
    uStack_174 = 0xaaaaaaaa;
    uStack_170 = 0xaaaaaaaa;
    uStack_16c = 0xaaaaaaaa;
    QTextStream::QTextStream((QTextStream *)&local_178,&local_168,2);
    local_198.size = -0x5555555555555556;
    local_198.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_198.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
    pQVar21 = pMVar20->project;
    ProKey::ProKey((ProKey *)&local_428,"VERSION");
    QMakeEvaluator::first
              ((ProString *)&local_3b8,&pQVar21->super_QMakeEvaluator,(ProKey *)&local_428);
    ProString::toQString((QString *)&local_498,(ProString *)&local_3b8);
    QString::QString((QString *)&fi,".");
    QString::split(&local_198,(QArrayDataPointer<char16_t> *)&local_498,
                   (QArrayDataPointer<char16_t> *)&fi,1,1);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&fi);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_498);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
    for (iVar18 = (int)local_198.size; iVar18 < 4; iVar18 = iVar18 + 1) {
      QString::QString((QString *)&local_3b8,"0");
      QList<QString>::emplaceBack<QString>((QList<QString> *)&local_198,(QString *)&local_3b8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3b8);
    }
    local_1b8.size = -0x5555555555555556;
    local_1b8.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_1b8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    QListSpecialMethods<QString>::join
              ((QString *)&local_1b8,(QListSpecialMethods<QString> *)&local_198,(QChar)0x2e);
    local_1d8.d = (Data *)0x0;
    local_1d8.ptr = (QString *)0x0;
    local_1d8.size = 0;
    pQVar21 = this_00->project;
    ProKey::ProKey((ProKey *)&local_3b8,"RC_ICONS");
    pPVar7 = QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&local_3b8);
    local_1f0.d = (pPVar7->super_QList<ProString>).d.d;
    pPVar15 = (pPVar7->super_QList<ProString>).d.ptr;
    lVar22 = (pPVar7->super_QList<ProString>).d.size;
    if (local_1f0.d != (Data *)0x0) {
      LOCK();
      ((local_1f0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_1f0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_1f0.ptr = pPVar15;
    local_1f0.size = lVar22;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3b8);
    QList<QString>::reserve((QList<QString> *)&local_1d8,lVar22);
    for (lVar22 = lVar22 * 0x30; lVar22 != 0; lVar22 = lVar22 + -0x30) {
      ProString::toQString((QString *)&local_428,pPVar15);
      MakefileGenerator::fileFixify
                ((QString *)&local_3b8,this_00,(QString *)&local_428,(FileFixifyTypes)0x4,true);
      QList<QString>::emplaceBack<QString>((QList<QString> *)&local_1d8,(QString *)&local_3b8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3b8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
      pPVar15 = pPVar15 + 1;
    }
    local_208.d = (Data *)0x0;
    local_208.ptr = (char16_t *)0x0;
    local_208.size = 0;
    pQVar21 = this_00->project;
    pMVar24 = this_00;
    ProKey::ProKey((ProKey *)&local_3b8,"QMAKE_TARGET_COMPANY");
    pPVar7 = QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&local_3b8);
    lVar22 = (pPVar7->super_QList<ProString>).d.size;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3b8);
    if (lVar22 != 0) {
      pQVar21 = this_00->project;
      ProKey::ProKey((ProKey *)&local_3b8,"QMAKE_TARGET_COMPANY");
      pPVar7 = QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&local_3b8);
      ProStringList::join((QString *)&local_428,pPVar7,(QChar)0x20);
      local_208.ptr = local_428.a.a.a.m_string.d.ptr;
      local_208.d = local_428.a.a.a.m_string.d.d;
      local_428.a.a.a.m_string.d.d = (Data *)0x0;
      local_428.a.a.a.m_string.d.ptr = (char16_t *)0x0;
      local_208.size = local_428.a.a.a.m_string.d.size;
      local_428.a.a.a.m_string.d.size = 0;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3b8);
    }
    local_228.d = (Data *)0x0;
    local_228.ptr = (char16_t *)0x0;
    local_228.size = 0;
    pQVar21 = this_00->project;
    ProKey::ProKey((ProKey *)&local_3b8,"QMAKE_TARGET_DESCRIPTION");
    pPVar7 = QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&local_3b8);
    lVar22 = (pPVar7->super_QList<ProString>).d.size;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3b8);
    if (lVar22 != 0) {
      pQVar21 = this_00->project;
      ProKey::ProKey((ProKey *)&local_3b8,"QMAKE_TARGET_DESCRIPTION");
      pPVar7 = QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&local_3b8);
      ProStringList::join((QString *)&local_428,pPVar7,(QChar)0x20);
      local_228.ptr = local_428.a.a.a.m_string.d.ptr;
      local_228.d = local_428.a.a.a.m_string.d.d;
      local_428.a.a.a.m_string.d.d = (Data *)0x0;
      local_428.a.a.a.m_string.d.ptr = (char16_t *)0x0;
      local_228.size = local_428.a.a.a.m_string.d.size;
      local_428.a.a.a.m_string.d.size = 0;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3b8);
    }
    local_248.d = (Data *)0x0;
    local_248.ptr = (char16_t *)0x0;
    local_248.size = 0;
    pQVar21 = this_00->project;
    ProKey::ProKey((ProKey *)&local_3b8,"QMAKE_TARGET_COPYRIGHT");
    pPVar7 = QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&local_3b8);
    lVar22 = (pPVar7->super_QList<ProString>).d.size;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3b8);
    if (lVar22 != 0) {
      pQVar21 = this_00->project;
      ProKey::ProKey((ProKey *)&local_3b8,"QMAKE_TARGET_COPYRIGHT");
      pPVar7 = QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&local_3b8);
      ProStringList::join((QString *)&local_428,pPVar7,(QChar)0x20);
      local_248.ptr = local_428.a.a.a.m_string.d.ptr;
      local_248.d = local_428.a.a.a.m_string.d.d;
      local_428.a.a.a.m_string.d.d = (Data *)0x0;
      local_428.a.a.a.m_string.d.ptr = (char16_t *)0x0;
      local_248.size = local_428.a.a.a.m_string.d.size;
      local_428.a.a.a.m_string.d.size = 0;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3b8);
    }
    local_268.d = (Data *)0x0;
    local_268.ptr = (char16_t *)0x0;
    local_268.size = 0;
    pQVar21 = this_00->project;
    ProKey::ProKey((ProKey *)&local_3b8,"QMAKE_TARGET_PRODUCT");
    pPVar7 = QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&local_3b8);
    lVar22 = (pPVar7->super_QList<ProString>).d.size;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3b8);
    if (lVar22 == 0) {
      pQVar21 = this_00->project;
      pQVar16 = (QArrayDataPointer<char16_t> *)&local_428;
      ProKey::ProKey((ProKey *)pQVar16,"TARGET");
      pPVar15 = (ProString *)&local_3b8;
      QMakeEvaluator::first(pPVar15,&pQVar21->super_QMakeEvaluator,(ProKey *)pQVar16);
      ProString::toQString((QString *)&local_498,pPVar15);
      local_268.ptr = local_498.a.a.m_string.d.ptr;
      local_268.d = local_498.a.a.m_string.d.d;
      local_498.a.a.m_string.d.d = (Data *)0x0;
      local_498.a.a.m_string.d.ptr = (char16_t *)0x0;
      local_268.size = local_498.a.a.m_string.d.size;
      local_498.a.a.m_string.d.size = 0;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_498);
    }
    else {
      pQVar21 = this_00->project;
      pQVar16 = (QArrayDataPointer<char16_t> *)&local_3b8;
      ProKey::ProKey((ProKey *)pQVar16,"QMAKE_TARGET_PRODUCT");
      pPVar7 = QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)pQVar16);
      pPVar15 = (ProString *)&local_428;
      ProStringList::join((QString *)pPVar15,pPVar7,(QChar)0x20);
      local_268.ptr = local_428.a.a.a.m_string.d.ptr;
      local_268.d = local_428.a.a.a.m_string.d.d;
      local_428.a.a.a.m_string.d.d = (Data *)0x0;
      local_428.a.a.a.m_string.d.ptr = (char16_t *)0x0;
      local_268.size = local_428.a.a.a.m_string.d.size;
      local_428.a.a.a.m_string.d.size = 0;
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)pPVar15);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(pQVar16);
    local_288.d = (Data *)0x0;
    local_288.ptr = (char16_t *)0x0;
    local_288.size = 0;
    pQVar21 = this_00->project;
    ProKey::ProKey((ProKey *)&local_3b8,"QMAKE_TARGET_ORIGINAL_FILENAME");
    pPVar7 = QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&local_3b8);
    lVar22 = (pPVar7->super_QList<ProString>).d.size;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3b8);
    if (lVar22 == 0) {
      pQVar21 = this_00->project;
      pQVar16 = (QArrayDataPointer<char16_t> *)&local_498;
      ProKey::ProKey((ProKey *)pQVar16,"TARGET");
      QMakeEvaluator::first
                ((ProString *)&local_428,&pQVar21->super_QMakeEvaluator,(ProKey *)pQVar16);
      pQVar21 = this_00->project;
      ProKey::ProKey((ProKey *)&local_2b8,"TARGET_EXT");
      QMakeEvaluator::first((ProString *)&fi,&pQVar21->super_QMakeEvaluator,(ProKey *)&local_2b8);
      QStringBuilder<ProString,_ProString>::QStringBuilder
                ((QStringBuilder<ProString,_ProString> *)&local_3b8,(ProString *)&local_428,
                 (ProString *)&fi);
      this_00 = pMVar24;
      QStringBuilder<ProString,_ProString>::convertTo<QString>
                ((QString *)&local_508,(QStringBuilder<ProString,_ProString> *)&local_3b8);
      local_288.ptr = local_508.super_ProString.m_string.d.ptr;
      local_288.d = local_508.super_ProString.m_string.d.d;
      local_508.super_ProString.m_string.d.d = (Data *)0x0;
      local_508.super_ProString.m_string.d.ptr = (char16_t *)0x0;
      local_288.size = local_508.super_ProString.m_string.d.size;
      local_508.super_ProString.m_string.d.size = 0;
      pMVar24 = this_00;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_508);
      QStringBuilder<ProString,_ProString>::~QStringBuilder
                ((QStringBuilder<ProString,_ProString> *)&local_3b8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&fi);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_2b8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
    }
    else {
      pQVar21 = this_00->project;
      pQVar16 = (QArrayDataPointer<char16_t> *)&local_3b8;
      ProKey::ProKey((ProKey *)pQVar16,"QMAKE_TARGET_ORIGINAL_FILENAME");
      pPVar7 = QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)pQVar16);
      ProStringList::join((QString *)&local_428,pPVar7,(QChar)0x20);
      local_288.ptr = local_428.a.a.a.m_string.d.ptr;
      local_288.d = local_428.a.a.a.m_string.d.d;
      local_428.a.a.a.m_string.d.d = (Data *)0x0;
      local_428.a.a.a.m_string.d.ptr = (char16_t *)0x0;
      local_288.size = local_428.a.a.a.m_string.d.size;
      local_428.a.a.a.m_string.d.size = 0;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(pQVar16);
    local_2d8.d = (Data *)0x0;
    local_2d8.ptr = (char16_t *)0x0;
    local_2d8.size = 0;
    pQVar21 = this_00->project;
    ProKey::ProKey((ProKey *)&local_3b8,"QMAKE_TARGET_INTERNALNAME");
    pPVar7 = QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&local_3b8);
    lVar22 = (pPVar7->super_QList<ProString>).d.size;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3b8);
    if (lVar22 != 0) {
      pQVar21 = this_00->project;
      ProKey::ProKey((ProKey *)&local_3b8,"QMAKE_TARGET_INTERNALNAME");
      pPVar7 = QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&local_3b8);
      ProStringList::join((QString *)&local_428,pPVar7,(QChar)0x20);
      local_2d8.ptr = local_428.a.a.a.m_string.d.ptr;
      local_2d8.d = local_428.a.a.a.m_string.d.d;
      local_428.a.a.a.m_string.d.d = (Data *)0x0;
      local_428.a.a.a.m_string.d.ptr = (char16_t *)0x0;
      local_2d8.size = local_428.a.a.a.m_string.d.size;
      local_428.a.a.a.m_string.d.size = 0;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3b8);
    }
    local_2f8.d = (Data *)0x0;
    local_2f8.ptr = (char16_t *)0x0;
    local_2f8.size = 0;
    pQVar21 = this_00->project;
    ProKey::ProKey((ProKey *)&local_3b8,"QMAKE_TARGET_COMMENTS");
    pPVar7 = QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&local_3b8);
    lVar22 = (pPVar7->super_QList<ProString>).d.size;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3b8);
    if (lVar22 != 0) {
      pQVar21 = this_00->project;
      ProKey::ProKey((ProKey *)&local_3b8,"QMAKE_TARGET_COMMENTS");
      pPVar7 = QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&local_3b8);
      ProStringList::join((QString *)&local_428,pPVar7,(QChar)0x20);
      local_2f8.ptr = local_428.a.a.a.m_string.d.ptr;
      local_2f8.d = local_428.a.a.a.m_string.d.d;
      local_428.a.a.a.m_string.d.d = (Data *)0x0;
      local_428.a.a.a.m_string.d.ptr = (char16_t *)0x0;
      local_2f8.size = local_428.a.a.a.m_string.d.size;
      local_428.a.a.a.m_string.d.size = 0;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3b8);
    }
    local_318.d = (Data *)0x0;
    local_318.ptr = (char16_t *)0x0;
    local_318.size = 0;
    pQVar21 = this_00->project;
    ProKey::ProKey((ProKey *)&local_3b8,"QMAKE_TARGET_TRADEMARKS");
    pPVar7 = QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&local_3b8);
    lVar22 = (pPVar7->super_QList<ProString>).d.size;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3b8);
    if (lVar22 != 0) {
      pQVar21 = this_00->project;
      ProKey::ProKey((ProKey *)&local_3b8,"QMAKE_TARGET_TRADEMARKS");
      pPVar7 = QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&local_3b8);
      ProStringList::join((QString *)&local_428,pPVar7,(QChar)0x20);
      local_318.ptr = local_428.a.a.a.m_string.d.ptr;
      local_318.d = local_428.a.a.a.m_string.d.d;
      local_428.a.a.a.m_string.d.d = (Data *)0x0;
      local_428.a.a.a.m_string.d.ptr = (char16_t *)0x0;
      local_318.size = local_428.a.a.a.m_string.d.size;
      local_428.a.a.a.m_string.d.size = 0;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3b8);
    }
    pQVar21 = this_00->project;
    ProKey::ProKey((ProKey *)&local_3b8,"RC_LANG");
    in_stack_fffffffffffffa7c = QMakeProject::intValue(pQVar21,(ProKey *)&local_3b8,0x409);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3b8);
    pQVar21 = this_00->project;
    ProKey::ProKey((ProKey *)&local_3b8,"RC_CODEPAGE");
    iVar18 = QMakeProject::intValue(pQVar21,(ProKey *)&local_3b8,0x4b0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3b8);
    QTextStream::operator<<((QTextStream *)&local_178,"#include <windows.h>\n");
    Qt::endl((QTextStream *)&local_178);
    if (local_1d8.size != 0) {
      lVar22 = 0;
      uVar17 = 0;
      this_00 = pMVar24;
      while (uVar17 < (ulong)local_1d8.size) {
        QString::QString((QString *)&local_498,"IDI_ICON%1\tICON\t%2");
        uVar17 = uVar17 + 1;
        QString::arg<int,_true>
                  ((QString *)&local_428,(QString *)&local_498,(int)uVar17,0,10,(QChar)0x20);
        pQVar8 = QList<QString>::data((QList<QString> *)&local_1d8);
        cQuoted((QString *)&fi,(QString *)((long)&(pQVar8->d).d + lVar22));
        QString::arg<QString,_true>
                  ((QString *)&local_3b8,(QString *)&local_428,(QString *)&fi,0,(QChar)0x20);
        pQVar9 = (QTextStream *)
                 QTextStream::operator<<((QTextStream *)&local_178,(QString *)&local_3b8);
        Qt::endl(pQVar9);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3b8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&fi);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_498);
        lVar22 = lVar22 + 0x18;
      }
      Qt::endl((QTextStream *)&local_178);
      pMVar24 = this_00;
    }
    if (local_58.size != 0) {
      local_498.a.a.m_string.d.d = (Data *)0x0;
      local_498.a.a.m_string.d.ptr = (char16_t *)0x0;
      local_498.a.a.m_string.d.size = 0;
      pQVar21 = this_00->project;
      ProKey::ProKey((ProKey *)&local_428,"TEMPLATE");
      QMakeEvaluator::first
                ((ProString *)&local_3b8,&pQVar21->super_QMakeEvaluator,(ProKey *)&local_428);
      bVar5 = ProString::operator==((ProString *)&local_3b8,"lib");
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3b8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
      local_3a8 = (char *)local_498.a.a.m_string.d.size;
      pcStack_3b0 = local_498.a.a.m_string.d.ptr;
      if (bVar5) {
        local_498.a.a.m_string.d.ptr = L"ISOLATIONAWARE_MANIFEST_RESOURCE_ID";
        local_498.a.a.m_string.d.size = 0x23;
      }
      else {
        local_498.a.a.m_string.d.ptr = L"CREATEPROCESS_MANIFEST_RESOURCE_ID";
        local_498.a.a.m_string.d.size = 0x22;
      }
      local_3b8 = (QString *)local_498.a.a.m_string.d.d;
      local_428.a.a.a.m_string.d.size = 0;
      local_428.a.a.a.m_string.d.ptr = (char16_t *)0x0;
      local_428.a.a.a.m_string.d.d = (Data *)0x0;
      local_498.a.a.m_string.d.d = (Data *)0x0;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3b8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
      pQVar9 = (QTextStream *)
               QTextStream::operator<<((QTextStream *)&local_178,(QString *)&local_498);
      pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9," RT_MANIFEST \"");
      pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,(QString *)&local_58);
      QTextStream::operator<<(pQVar9,"\"\n");
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_498);
    }
    QTextStream::operator<<((QTextStream *)&local_178,"VS_VERSION_INFO VERSIONINFO\n");
    pQVar9 = (QTextStream *)QTextStream::operator<<((QTextStream *)&local_178,"\tFILEVERSION ");
    local_3b8 = (QString *)local_1b8.d;
    pcStack_3b0 = local_1b8.ptr;
    local_3a8 = (char *)local_1b8.size;
    if ((QString *)local_1b8.d != (QString *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)&((DataPointer *)&(local_1b8.d)->super_QArrayData)->d)->_q_value).
      super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)&((DataPointer *)&(local_1b8.d)->super_QArrayData)->d)->_q_value).
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QString::QString((QString *)&local_428,".");
    QString::QString((QString *)&local_498,",");
    pQVar10 = (QString *)
              QString::replace((QString *)&local_3b8,(QString *)&local_428,
                               (CaseSensitivity)(QArrayDataPointer<char16_t> *)&local_498);
    pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,pQVar10);
    Qt::endl(pQVar9);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_498);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3b8);
    pQVar9 = (QTextStream *)QTextStream::operator<<((QTextStream *)&local_178,"\tPRODUCTVERSION ");
    local_3b8 = (QString *)local_1b8.d;
    pcStack_3b0 = local_1b8.ptr;
    local_3a8 = (char *)local_1b8.size;
    if ((QString *)local_1b8.d != (QString *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)&((DataPointer *)&(local_1b8.d)->super_QArrayData)->d)->_q_value).
      super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)&((DataPointer *)&(local_1b8.d)->super_QArrayData)->d)->_q_value).
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QString::QString((QString *)&local_428,".");
    QString::QString((QString *)&local_498,",");
    pQVar10 = (QString *)
              QString::replace((QString *)&local_3b8,(QString *)&local_428,
                               (CaseSensitivity)(QArrayDataPointer<char16_t> *)&local_498);
    pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,pQVar10);
    Qt::endl(pQVar9);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_498);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3b8);
    QTextStream::operator<<((QTextStream *)&local_178,"\tFILEFLAGSMASK 0x3fL\n");
    QTextStream::operator<<((QTextStream *)&local_178,"#ifdef _DEBUG\n");
    QTextStream::operator<<((QTextStream *)&local_178,"\tFILEFLAGS VS_FF_DEBUG\n");
    QTextStream::operator<<((QTextStream *)&local_178,"#else\n");
    QTextStream::operator<<((QTextStream *)&local_178,"\tFILEFLAGS 0x0L\n");
    QTextStream::operator<<((QTextStream *)&local_178,"#endif\n");
    QTextStream::operator<<((QTextStream *)&local_178,"\tFILEOS VOS_NT_WINDOWS32\n");
    pQVar21 = this_00->project;
    QString::QString((QString *)&local_3b8,"shared");
    bVar5 = QMakeProject::isActiveConfig(pQVar21,(QString *)&local_3b8,false);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3b8);
    pcVar19 = "\tFILETYPE VFT_APP\n";
    if (bVar5) {
      pcVar19 = "\tFILETYPE VFT_DLL\n";
    }
    QTextStream::operator<<((QTextStream *)&local_178,pcVar19);
    QTextStream::operator<<((QTextStream *)&local_178,"\tFILESUBTYPE VFT2_UNKNOWN\n");
    QTextStream::operator<<((QTextStream *)&local_178,"\tBEGIN\n");
    QTextStream::operator<<((QTextStream *)&local_178,"\t\tBLOCK \"StringFileInfo\"\n");
    QTextStream::operator<<((QTextStream *)&local_178,"\t\tBEGIN\n");
    pQVar9 = (QTextStream *)QTextStream::operator<<((QTextStream *)&local_178,"\t\t\tBLOCK \"");
    QString::QString((QString *)&local_498,"%1%2");
    QString::arg<int,_true>
              ((QString *)&local_428,(QString *)&local_498,in_stack_fffffffffffffa7c,4,0x10,
               (QChar)0x30);
    QString::arg<int,_true>((QString *)&local_3b8,(QString *)&local_428,iVar18,4,0x10,(QChar)0x30);
    pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,(QString *)&local_3b8);
    QTextStream::operator<<(pQVar9,"\"\n");
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_498);
    QTextStream::operator<<((QTextStream *)&local_178,"\t\t\tBEGIN\n");
    pQVar9 = (QTextStream *)
             QTextStream::operator<<((QTextStream *)&local_178,"\t\t\t\tVALUE \"CompanyName\", \"");
    pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,(QString *)&local_208);
    QTextStream::operator<<(pQVar9,"\\0\"\n");
    pQVar9 = (QTextStream *)
             QTextStream::operator<<
                       ((QTextStream *)&local_178,"\t\t\t\tVALUE \"FileDescription\", \"");
    pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,(QString *)&local_228);
    QTextStream::operator<<(pQVar9,"\\0\"\n");
    pQVar9 = (QTextStream *)
             QTextStream::operator<<((QTextStream *)&local_178,"\t\t\t\tVALUE \"FileVersion\", \"");
    pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,(QString *)&local_1b8);
    QTextStream::operator<<(pQVar9,"\\0\"\n");
    pQVar9 = (QTextStream *)
             QTextStream::operator<<
                       ((QTextStream *)&local_178,"\t\t\t\tVALUE \"LegalCopyright\", \"");
    pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,(QString *)&local_248);
    QTextStream::operator<<(pQVar9,"\\0\"\n");
    pQVar9 = (QTextStream *)
             QTextStream::operator<<
                       ((QTextStream *)&local_178,"\t\t\t\tVALUE \"OriginalFilename\", \"");
    pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,(QString *)&local_288);
    QTextStream::operator<<(pQVar9,"\\0\"\n");
    pQVar9 = (QTextStream *)
             QTextStream::operator<<((QTextStream *)&local_178,"\t\t\t\tVALUE \"ProductName\", \"");
    pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,(QString *)&local_268);
    QTextStream::operator<<(pQVar9,"\\0\"\n");
    pQVar9 = (QTextStream *)
             QTextStream::operator<<
                       ((QTextStream *)&local_178,"\t\t\t\tVALUE \"ProductVersion\", \"");
    pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,(QString *)&local_1b8);
    QTextStream::operator<<(pQVar9,"\\0\"\n");
    pQVar9 = (QTextStream *)
             QTextStream::operator<<((QTextStream *)&local_178,"\t\t\t\tVALUE \"InternalName\", \"")
    ;
    pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,(QString *)&local_2d8);
    QTextStream::operator<<(pQVar9,"\\0\"\n");
    pQVar9 = (QTextStream *)
             QTextStream::operator<<((QTextStream *)&local_178,"\t\t\t\tVALUE \"Comments\", \"");
    pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,(QString *)&local_2f8);
    QTextStream::operator<<(pQVar9,"\\0\"\n");
    pQVar9 = (QTextStream *)
             QTextStream::operator<<
                       ((QTextStream *)&local_178,"\t\t\t\tVALUE \"LegalTrademarks\", \"");
    pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,(QString *)&local_318);
    QTextStream::operator<<(pQVar9,"\\0\"\n");
    QTextStream::operator<<((QTextStream *)&local_178,"\t\t\tEND\n");
    QTextStream::operator<<((QTextStream *)&local_178,"\t\tEND\n");
    QTextStream::operator<<((QTextStream *)&local_178,"\t\tBLOCK \"VarFileInfo\"\n");
    QTextStream::operator<<((QTextStream *)&local_178,"\t\tBEGIN\n");
    pQVar9 = (QTextStream *)
             QTextStream::operator<<((QTextStream *)&local_178,"\t\t\tVALUE \"Translation\", ");
    QString::QString((QString *)&local_428,"0x%1");
    QString::arg<int,_true>
              ((QString *)&local_3b8,(QString *)&local_428,in_stack_fffffffffffffa7c,4,0x10,
               (QChar)0x30);
    pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,(QString *)&local_3b8);
    pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,", ");
    QString::QString((QString *)&fi,"%1");
    QString::arg<int,_true>((QString *)&local_498,(QString *)&fi,iVar18,4,10,(QChar)0x20);
    pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,(QString *)&local_498);
    Qt::endl(pQVar9);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_498);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&fi);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
    QTextStream::operator<<((QTextStream *)&local_178,"\t\tEND\n");
    QTextStream::operator<<((QTextStream *)&local_178,"\tEND\n");
    QTextStream::operator<<((QTextStream *)&local_178,"/* End of Version info */\n");
    Qt::endl((QTextStream *)&local_178);
    QTextStream::flush();
    local_338.size = -0x5555555555555556;
    local_338.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_338.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    pQVar21 = pMVar24->project;
    pMVar20 = pMVar24;
    ProKey::ProKey(&local_508,"OUT_PWD");
    QMakeEvaluator::first(&local_2b8,&pQVar21->super_QMakeEvaluator,&local_508);
    ProString::ProString((ProString *)&fi,&local_2b8);
    pQVar21 = pMVar24->project;
    ProKey::ProKey((ProKey *)local_568,"TARGET");
    QMakeEvaluator::first(&local_538,&pQVar21->super_QMakeEvaluator,(ProKey *)local_568);
    QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString>::QStringBuilder
              (&local_498,(QStringBuilder<ProString,_const_char_(&)[2]> *)&fi,&local_538);
    QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString>::QStringBuilder
              (&local_428.a,&local_498);
    local_428.b = (char (*) [10])0x22373e;
    QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString>,_const_char_(&)[10]>
    ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString>,_const_char_(&)[10]>
                      *)&local_3b8,&local_428);
    local_348 = (char (*) [4])0x21ff61;
    QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString>,_const_char_(&)[10]>,_const_char_(&)[4]>
    ::convertTo<QString>
              ((QString *)&local_338,
               (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString>,_const_char_(&)[10]>,_const_char_(&)[4]>
                *)&local_3b8);
    QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString>::~QStringBuilder
              ((QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString> *)&local_3b8
              );
    QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString>::~QStringBuilder
              (&local_428.a);
    QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString>::~QStringBuilder
              (&local_498);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_538);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(local_568);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&fi);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_2b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_508);
    _fi = (Data *)0xaaaaaaaaaaaaaaaa;
    QDir::cleanPath((QString *)&local_3b8);
    QFile::QFile((QFile *)&fi,(QString *)&local_3b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3b8);
    cVar6 = QFile::exists();
    if ((cVar6 == '\0') || (cVar6 = QFile::open(&fi,1), cVar6 == '\0')) {
LAB_001db33b:
      cVar6 = QFile::open(&fi,2);
      if (cVar6 == '\0') {
        local_3b8 = (QString *)0x0;
        pcStack_3b0 = (char16_t *)0x0;
        local_3a8 = (char *)0x0;
        QDir::QDir((QDir *)&local_498,(QString *)&local_3b8);
        QFileInfo::QFileInfo((QFileInfo *)&local_2b8,(QFileDevice *)&fi);
        QFileInfo::path();
        QDir::mkpath((QDir *)&local_498,(QArrayDataPointer<char16_t> *)&local_428,0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
        QFileInfo::~QFileInfo((QFileInfo *)&local_2b8);
        QDir::~QDir((QDir *)&local_498);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3b8);
        cVar6 = QFile::open((QFileDevice *)&fi,2);
        __stream = _stderr;
        if (cVar6 == '\0') {
          QFile::fileName();
          QString::toLatin1((QByteArray *)&local_3b8,(QString *)&local_428);
          pcVar14 = pcStack_3b0;
          if (pcStack_3b0 == (char16_t *)0x0) {
            pcVar14 = (char16_t *)&QByteArray::_empty;
          }
          fprintf(__stream,"Cannot open for writing: %s",pcVar14);
          QByteArray::~QByteArray((QByteArray *)&local_3b8);
          QString::~QString((QString *)&local_428);
          goto LAB_001dbceb;
        }
      }
      QIODevice::write((QByteArray *)&fi);
      QFileDevice::close();
    }
    else {
      QIODevice::readAll();
      bVar5 = operator!=((QByteArray *)&local_3b8,(QByteArray *)&local_168);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_3b8);
      QFileDevice::close();
      if (bVar5) goto LAB_001db33b;
    }
    pQVar21 = pMVar20->project;
    this_00 = pMVar20;
    ProKey::ProKey((ProKey *)&local_3b8,"QMAKE_WRITE_DEFAULT_RC");
    pPVar7 = QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&local_3b8);
    lVar22 = (pPVar7->super_QList<ProString>).d.size;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3b8);
    if (lVar22 == 0) {
      pQVar21 = pMVar20->project;
      ProKey::ProKey((ProKey *)&local_3b8,"RC_FILE");
      pQVar11 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&local_3b8)->
                 super_QList<ProString>;
      QFile::fileName();
      ProString::ProString((ProString *)&local_428,(QString *)&local_498);
      QList<ProString>::emplace<ProString>(pQVar11,0,(ProString *)&local_428);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_498);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3b8);
    }
    QFile::~QFile((QFile *)&fi);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_338);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_318);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2f8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2d8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_288);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_268);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_248);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_228);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_1f0);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_1d8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1b8);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_198);
    QTextStream::~QTextStream((QTextStream *)&local_178);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_168);
  }
  pQVar21 = pMVar20->project;
  ProKey::ProKey((ProKey *)&local_3b8,"RC_FILE");
  pPVar7 = QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&local_3b8);
  lVar22 = (pPVar7->super_QList<ProString>).d.size;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3b8);
  if (lVar22 != 0) {
    pQVar21 = pMVar20->project;
    ProKey::ProKey((ProKey *)&local_3b8,"RES_FILE");
    pPVar7 = QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&local_3b8);
    lVar22 = (pPVar7->super_QList<ProString>).d.size;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3b8);
    if (lVar22 != 0) {
      fwrite("Both rc and res file specified.\n",0x20,1,_stderr);
      fwrite("Please specify one of them, not both.",0x25,1,_stderr);
LAB_001dbceb:
      exit(1);
    }
    local_2b8.m_string.d.size = -0x5555555555555556;
    local_2b8.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_2b8.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    pQVar21 = pMVar20->project;
    ProKey::ProKey((ProKey *)&local_428,"RC_FILE");
    QMakeEvaluator::first
              ((ProString *)&local_3b8,&pQVar21->super_QMakeEvaluator,(ProKey *)&local_428);
    ProString::toQString(&local_2b8.m_string,(ProString *)&local_3b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
    qmake_getpwd();
    bVar5 = operator!=(&Option::output_dir,(QString *)&local_3b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3b8);
    pMVar20 = this_00;
    if (bVar5) {
      _fi = (Data *)0xaaaaaaaaaaaaaaaa;
      QFileInfo::QFileInfo(&fi,(QString *)&local_2b8);
      QFileInfo::absoluteFilePath();
      ProString::ProString((ProString *)&local_3b8,(QString *)&local_498);
      pQVar21 = this_00->project;
      ProKey::ProKey((ProKey *)&local_428,"RC_FILE");
      pQVar11 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&local_428)->
                 super_QList<ProString>;
      iVar12 = QList<ProString>::begin(pQVar11);
      ProString::operator=(iVar12.i,(ProString *)&local_3b8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3b8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_498);
      QFileInfo::~QFileInfo(&fi);
    }
    pQVar10 = (QString *)QtPrivate::lengthHelperPointer<char>(".rc");
    QString::replace((QLatin1String *)&local_2b8,pQVar10,0x21ff61);
    pQVar21 = this_00->project;
    ProKey::ProKey((ProKey *)&local_3b8,"RES_FILE");
    pQVar11 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&local_3b8)->
               super_QList<ProString>;
    local_580.d = local_2b8.m_string.d.d;
    local_580.ptr = local_2b8.m_string.d.ptr;
    local_580.size = local_2b8.m_string.d.size;
    if (local_2b8.m_string.d.d != (Data *)0x0) {
      LOCK();
      ((local_2b8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_2b8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
    file.d.ptr._0_4_ = iVar18;
    file.d.d = (Data *)pMVar20;
    file.d.ptr._4_4_ = uVar25;
    file.d.size._0_4_ = in_stack_fffffffffffffa78;
    file.d.size._4_4_ = in_stack_fffffffffffffa7c;
    MakefileGenerator::fileInfo((MakefileGenerator *)&fi,file);
    QFileInfo::fileName();
    ProString::ProString((ProString *)&local_428,(QString *)&local_498);
    QList<ProString>::emplaceFront<ProString>(pQVar11,(ProString *)&local_428);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_498);
    QFileInfo::~QFileInfo(&fi);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_580);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3b8);
    local_508.super_ProString.m_string.d.d = (Data *)0x0;
    local_508.super_ProString.m_string.d.ptr = (char16_t *)0x0;
    local_508.super_ProString.m_string.d.size = 0;
    pQVar21 = this_00->project;
    QString::QString((QString *)&local_3b8,"staticlib");
    bVar5 = QMakeProject::isActiveConfig(pQVar21,(QString *)&local_3b8,false);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3b8);
    if (bVar5) {
      pQVar21 = this_00->project;
      pcVar19 = "DESTDIR";
    }
    else {
      pQVar21 = this_00->project;
      pcVar19 = "OBJECTS_DIR";
    }
    ProKey::ProKey((ProKey *)&local_428,pcVar19);
    QMakeEvaluator::first
              ((ProString *)&local_3b8,&pQVar21->super_QMakeEvaluator,(ProKey *)&local_428);
    ProString::toQString((QString *)&local_498,(ProString *)&local_3b8);
    qVar4 = local_498.a.a.m_string.d.size;
    local_508.super_ProString.m_string.d.ptr = local_498.a.a.m_string.d.ptr;
    local_508.super_ProString.m_string.d.d = local_498.a.a.m_string.d.d;
    local_498.a.a.m_string.d.d = (Data *)0x0;
    local_498.a.a.m_string.d.ptr = (char16_t *)0x0;
    local_508.super_ProString.m_string.d.size = local_498.a.a.m_string.d.size;
    local_498.a.a.m_string.d.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_498);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
    if ((Data *)qVar4 != (Data *)0x0) {
      QString::append((QString *)&local_508);
      pQVar21 = this_00->project;
      ProKey::ProKey((ProKey *)&local_3b8,"RES_FILE");
      pQVar11 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&local_3b8)->
                 super_QList<ProString>;
      iVar12 = QList<ProString>::begin(pQVar11);
      ProString::ProString((ProString *)&local_428,(QString *)&local_508);
      ProString::prepend(iVar12.i,(ProString *)&local_428);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3b8);
    }
    pQVar21 = this_00->project;
    ProKey::ProKey((ProKey *)&local_498,"RES_FILE");
    QMakeEvaluator::first
              ((ProString *)&local_428,&pQVar21->super_QMakeEvaluator,(ProKey *)&local_498);
    ProString::toQString((QString *)local_568,(ProString *)&local_428);
    Option::fixPathToTargetOS(&local_538.m_string,(QString *)local_568,false,true);
    ProString::ProString((ProString *)&local_3b8,&local_538.m_string);
    pQVar21 = this_00->project;
    ProKey::ProKey((ProKey *)&fi,"RES_FILE");
    pQVar11 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&fi)->
               super_QList<ProString>;
    iVar12 = QList<ProString>::begin(pQVar11);
    ProString::operator=(iVar12.i,(ProString *)&local_3b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&fi);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_538);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(local_568);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_498);
    pQVar21 = this_00->project;
    ProKey::ProKey((ProKey *)&local_3b8,"RES_FILE");
    pQVar11 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&local_3b8)->
               super_QList<ProString>;
    pQVar21 = this_00->project;
    ProKey::ProKey((ProKey *)&local_428,"POST_TARGETDEPS");
    pQVar13 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&local_428)->
               super_QList<ProString>;
    QList<ProString>::append(pQVar13,pQVar11);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3b8);
    pQVar21 = this_00->project;
    ProKey::ProKey((ProKey *)&local_3b8,"RES_FILE");
    pQVar11 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&local_3b8)->
               super_QList<ProString>;
    pQVar21 = this_00->project;
    ProKey::ProKey((ProKey *)&local_428,"CLEAN_FILES");
    pQVar13 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&local_428)->
               super_QList<ProString>;
    QList<ProString>::append(pQVar13,pQVar11);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_508);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_2b8);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
LAB_001dbb88:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Win32MakefileGenerator::processRcFileVar()
{
    if (Option::qmake_mode == Option::QMAKE_GENERATE_NOTHING)
        return;

    const QString manifestFile = project->first("QMAKE_MANIFEST").toQString();
    if (((!project->values("VERSION").isEmpty() || !project->values("RC_ICONS").isEmpty() || !manifestFile.isEmpty())
        && project->values("RC_FILE").isEmpty()
        && project->values("RES_FILE").isEmpty()
        && !project->isActiveConfig("no_generated_target_info")
        && (project->isActiveConfig("shared") || !project->values("QMAKE_APP_FLAG").isEmpty()))
        || !project->values("QMAKE_WRITE_DEFAULT_RC").isEmpty()){

        QByteArray rcString;
        QTextStream ts(&rcString, QFile::WriteOnly);

        QStringList vers = project->first("VERSION").toQString().split(".", Qt::SkipEmptyParts);
        for (int i = vers.size(); i < 4; i++)
            vers += "0";
        QString versionString = vers.join('.');

        QStringList rcIcons;
        const auto icons = project->values("RC_ICONS");
        rcIcons.reserve(icons.size());
        for (const ProString &icon : icons)
            rcIcons.append(fileFixify(icon.toQString(), FileFixifyAbsolute));

        QString companyName;
        if (!project->values("QMAKE_TARGET_COMPANY").isEmpty())
            companyName = project->values("QMAKE_TARGET_COMPANY").join(' ');

        QString description;
        if (!project->values("QMAKE_TARGET_DESCRIPTION").isEmpty())
            description = project->values("QMAKE_TARGET_DESCRIPTION").join(' ');

        QString copyright;
        if (!project->values("QMAKE_TARGET_COPYRIGHT").isEmpty())
            copyright = project->values("QMAKE_TARGET_COPYRIGHT").join(' ');

        QString productName;
        if (!project->values("QMAKE_TARGET_PRODUCT").isEmpty())
            productName = project->values("QMAKE_TARGET_PRODUCT").join(' ');
        else
            productName = project->first("TARGET").toQString();

        QString originalName;
        if (!project->values("QMAKE_TARGET_ORIGINAL_FILENAME").isEmpty())
            originalName = project->values("QMAKE_TARGET_ORIGINAL_FILENAME").join(' ');
        else
            originalName = project->first("TARGET") + project->first("TARGET_EXT");

        QString internalName;
        if (!project->values("QMAKE_TARGET_INTERNALNAME").isEmpty())
            internalName = project->values("QMAKE_TARGET_INTERNALNAME").join(' ');

        QString comments;
        if (!project->values("QMAKE_TARGET_COMMENTS").isEmpty())
            comments = project->values("QMAKE_TARGET_COMMENTS").join(' ');

        QString trademarks;
        if (!project->values("QMAKE_TARGET_TRADEMARKS").isEmpty())
            trademarks = project->values("QMAKE_TARGET_TRADEMARKS").join(' ');

        int rcLang = project->intValue("RC_LANG", 1033);            // default: English(USA)
        int rcCodePage = project->intValue("RC_CODEPAGE", 1200);    // default: Unicode

        ts << "#include <windows.h>\n";
        ts << Qt::endl;
        if (!rcIcons.isEmpty()) {
            for (int i = 0; i < rcIcons.size(); ++i)
                ts << QString("IDI_ICON%1\tICON\t%2").arg(i + 1).arg(cQuoted(rcIcons[i])) << Qt::endl;
            ts << Qt::endl;
        }
        if (!manifestFile.isEmpty()) {
            QString manifestResourceId;
            if (project->first("TEMPLATE") == "lib")
                manifestResourceId = QStringLiteral("ISOLATIONAWARE_MANIFEST_RESOURCE_ID");
            else
                manifestResourceId = QStringLiteral("CREATEPROCESS_MANIFEST_RESOURCE_ID");
            ts << manifestResourceId << " RT_MANIFEST \"" << manifestFile << "\"\n";
        }
        ts << "VS_VERSION_INFO VERSIONINFO\n";
        ts << "\tFILEVERSION " << QString(versionString).replace(".", ",") << Qt::endl;
        ts << "\tPRODUCTVERSION " << QString(versionString).replace(".", ",") << Qt::endl;
        ts << "\tFILEFLAGSMASK 0x3fL\n";
        ts << "#ifdef _DEBUG\n";
        ts << "\tFILEFLAGS VS_FF_DEBUG\n";
        ts << "#else\n";
        ts << "\tFILEFLAGS 0x0L\n";
        ts << "#endif\n";
        ts << "\tFILEOS VOS_NT_WINDOWS32\n";
        if (project->isActiveConfig("shared"))
            ts << "\tFILETYPE VFT_DLL\n";
        else
            ts << "\tFILETYPE VFT_APP\n";
        ts << "\tFILESUBTYPE VFT2_UNKNOWN\n";
        ts << "\tBEGIN\n";
        ts << "\t\tBLOCK \"StringFileInfo\"\n";
        ts << "\t\tBEGIN\n";
        ts << "\t\t\tBLOCK \""
           << QString("%1%2").arg(rcLang, 4, 16, QLatin1Char('0')).arg(rcCodePage, 4, 16, QLatin1Char('0'))
           << "\"\n";
        ts << "\t\t\tBEGIN\n";
        ts << "\t\t\t\tVALUE \"CompanyName\", \"" << companyName << "\\0\"\n";
        ts << "\t\t\t\tVALUE \"FileDescription\", \"" <<  description << "\\0\"\n";
        ts << "\t\t\t\tVALUE \"FileVersion\", \"" << versionString << "\\0\"\n";
        ts << "\t\t\t\tVALUE \"LegalCopyright\", \"" << copyright << "\\0\"\n";
        ts << "\t\t\t\tVALUE \"OriginalFilename\", \"" << originalName << "\\0\"\n";
        ts << "\t\t\t\tVALUE \"ProductName\", \"" << productName << "\\0\"\n";
        ts << "\t\t\t\tVALUE \"ProductVersion\", \"" << versionString << "\\0\"\n";
        ts << "\t\t\t\tVALUE \"InternalName\", \"" << internalName << "\\0\"\n";
        ts << "\t\t\t\tVALUE \"Comments\", \"" << comments << "\\0\"\n";
        ts << "\t\t\t\tVALUE \"LegalTrademarks\", \"" << trademarks << "\\0\"\n";
        ts << "\t\t\tEND\n";
        ts << "\t\tEND\n";
        ts << "\t\tBLOCK \"VarFileInfo\"\n";
        ts << "\t\tBEGIN\n";
        ts << "\t\t\tVALUE \"Translation\", "
           << QString("0x%1").arg(rcLang, 4, 16, QLatin1Char('0'))
           << ", " << QString("%1").arg(rcCodePage, 4) << Qt::endl;
        ts << "\t\tEND\n";
        ts << "\tEND\n";
        ts << "/* End of Version info */\n";
        ts << Qt::endl;

        ts.flush();


        QString rcFilename = project->first("OUT_PWD")
                           + "/"
                           + project->first("TARGET")
                           + "_resource"
                           + ".rc";
        QFile rcFile(QDir::cleanPath(rcFilename));

        bool writeRcFile = true;
        if (rcFile.exists() && rcFile.open(QFile::ReadOnly)) {
            writeRcFile = rcFile.readAll() != rcString;
            rcFile.close();
        }
        if (writeRcFile) {
            bool ok;
            ok = rcFile.open(QFile::WriteOnly);
            if (!ok) {
                // The file can't be opened... try creating the containing
                // directory first (needed for clean shadow builds)
                QDir().mkpath(QFileInfo(rcFile).path());
                ok = rcFile.open(QFile::WriteOnly);
            }
            if (!ok) {
                ::fprintf(stderr, "Cannot open for writing: %s", rcFile.fileName().toLatin1().constData());
                ::exit(1);
            }
            rcFile.write(rcString);
            rcFile.close();
        }
        if (project->values("QMAKE_WRITE_DEFAULT_RC").isEmpty())
            project->values("RC_FILE").insert(0, rcFile.fileName());
    }
    if (!project->values("RC_FILE").isEmpty()) {
        if (!project->values("RES_FILE").isEmpty()) {
            fprintf(stderr, "Both rc and res file specified.\n");
            fprintf(stderr, "Please specify one of them, not both.");
            exit(1);
        }
        QString resFile = project->first("RC_FILE").toQString();

        // if this is a shadow build then use the absolute path of the rc file
        if (Option::output_dir != qmake_getpwd()) {
            QFileInfo fi(resFile);
            project->values("RC_FILE").first() = fi.absoluteFilePath();
        }

        resFile.replace(QLatin1String(".rc"), Option::res_ext);
        project->values("RES_FILE").prepend(fileInfo(resFile).fileName());
        QString resDestDir;
        if (project->isActiveConfig("staticlib"))
            resDestDir = project->first("DESTDIR").toQString();
        else
            resDestDir = project->first("OBJECTS_DIR").toQString();
        if (!resDestDir.isEmpty()) {
            resDestDir.append(Option::dir_sep);
            project->values("RES_FILE").first().prepend(resDestDir);
        }
        project->values("RES_FILE").first() = Option::fixPathToTargetOS(
                    project->first("RES_FILE").toQString(), false);
        project->values("POST_TARGETDEPS") += project->values("RES_FILE");
        project->values("CLEAN_FILES") += project->values("RES_FILE");
    }
}